

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O1

bool __thiscall GdlLookupExpression::TestsJustification(GdlLookupExpression *this)

{
  bool bVar1;
  int iVar2;
  string local_30;
  
  bVar1 = GrcSymbolTableEntry::FitsSymbolType(this->m_psymName,ksymtProcState);
  if (bVar1) {
    GrcSymbolTableEntry::FullName_abi_cxx11_(&local_30,this->m_psymName);
    iVar2 = std::__cxx11::string::compare((char *)&local_30);
    bVar1 = iVar2 == 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool GdlLookupExpression::TestsJustification()
{
	if (!m_psymName->FitsSymbolType(ksymtProcState))
		return false;

	if (m_psymName->FullName() == "JustifyMode")
		return true;
	//if (m_psymName->FullName() == "JustifyLevel")
	//	return true;

	return false;
}